

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

int Cut_CellTruthLookup(uint *pTruth,int nVars)

{
  Cut_CMan_t *pCVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int local_d8;
  int i;
  uint Hash;
  Cut_Cell_t *pCell;
  Cut_Cell_t Cell;
  Cut_Cell_t *pTemp;
  Cut_CMan_t *p;
  int nVars_local;
  uint *pTruth_local;
  
  pCVar1 = s_pCMan;
  if (s_pCMan == (Cut_CMan_t *)0x0) {
    printf("Cut_CellTruthLookup: Cell manager is not defined.\n");
  }
  else {
    memset((Cut_Cell_t *)&pCell,0,0x98);
    Cell.nUsed = Cell.nUsed & 0xfffffff0U | nVars & 0xfU;
    Extra_TruthCopy((uint *)(Cell.Store + 0xe),pTruth,nVars);
    Cut_CellSuppMin((Cut_Cell_t *)&pCell);
    for (local_d8 = 0; local_d8 < (int)(Cell.nUsed & 0xfU); local_d8 = local_d8 + 1) {
      Cell.Box[local_d8] = (char)local_d8;
    }
    uVar2 = Extra_TruthSemiCanonicize
                      ((uint *)(Cell.Store + 0xe),pCVar1->puAux,Cell.nUsed & 0xf,Cell.Box,
                       (short *)(Cell.CanonPerm + 4));
    uVar4 = Cell.nUsed & 0xf;
    Cell.nUsed = Cell.nUsed & 0x3fffU | uVar2 << 0xe;
    iVar3 = Extra_TruthWordNum(uVar4);
    uVar4 = Extra_TruthHash((uint *)(Cell.Store + 0xe),iVar3);
    iVar3 = st__lookup(pCVar1->tTable,(char *)(ulong)uVar4,(char **)(Cell.uTruth + 0xf));
    if (iVar3 != 0) {
      for (; Cell._144_8_ != 0; Cell._144_8_ = *(undefined8 *)Cell._144_8_) {
        if (((*(uint *)(Cell._144_8_ + 0x20) & 0xf) == (Cell.nUsed & 0xfU)) &&
           (iVar3 = Extra_TruthIsEqual((uint *)(Cell._144_8_ + 0x54),(uint *)(Cell.Store + 0xe),
                                       Cell.nUsed & 0xf), iVar3 != 0)) {
          *(int *)(Cell._144_8_ + 0x18) = *(int *)(Cell._144_8_ + 0x18) + 1;
          pCVar1->nCellFound = pCVar1->nCellFound + 1;
          return 1;
        }
      }
    }
    pCVar1->nCellNotFound = pCVar1->nCellNotFound + 1;
  }
  return 0;
}

Assistant:

int Cut_CellTruthLookup( unsigned * pTruth, int nVars )
{
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    Cut_Cell_t Cell, * pCell = &Cell;
    unsigned Hash;
    int i;

    // cell manager is not defined
    if ( p == NULL )
    {
        printf( "Cut_CellTruthLookup: Cell manager is not defined.\n" );
        return 0;
    }

    // canonicize
    memset( pCell, 0, sizeof(Cut_Cell_t) );
    pCell->nVars = nVars;
    Extra_TruthCopy( pCell->uTruth, pTruth, nVars );
    Cut_CellSuppMin( pCell );
    // set the elementary permutation
    for ( i = 0; i < (int)pCell->nVars; i++ )
        pCell->CanonPerm[i] = i;
    // canonicize
    pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );


    // check if the cell exists
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum(pCell->nVars) );
    if ( st__lookup( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char **)&pTemp ) )
    {
        for ( ; pTemp; pTemp = pTemp->pNext )
        {
            if ( pTemp->nVars != pCell->nVars )
                continue;
            if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            {
                pTemp->nUsed++;
                p->nCellFound++;
                return 1;
            }
        }
    }
    p->nCellNotFound++;
    return 0;
}